

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdunzip.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  undefined8 uVar4;
  bool bVar5;
  int local_28;
  int local_24;
  int i;
  int nopts;
  char *zipfile;
  char **argv_local;
  int argc_local;
  
  lafe_setprogname(*argv,"bsdunzip");
  pcVar3 = setlocale(6,"");
  if (pcVar3 == (char *)0x0) {
    lafe_warnc(0,"Failed to set default locale");
  }
  iVar1 = isatty(1);
  if (iVar1 != 0) {
    tty = 1;
  }
  pcVar3 = getenv("UNZIP_DEBUG");
  if (pcVar3 != (char *)0x0) {
    unzip_debug = 1;
  }
  for (local_28 = 0; local_28 < argc; local_28 = local_28 + 1) {
    uVar4 = 10;
    if (local_28 < argc + -1) {
      uVar4 = 0x20;
    }
    debug("%s%c",argv[local_28],uVar4);
  }
  setenv("POSIXLY_CORRECT","",1);
  iVar1 = getopts(argc,argv);
  if (version_opt == 1) {
    version();
  }
  if ((zipinfo_mode != 0) && (Z1_opt == 0)) {
    printf("Zipinfo mode needs additional options\n");
    exit(1);
  }
  if (argc <= iVar1) {
    usage();
  }
  _i = argv[iVar1];
  iVar2 = strcmp(_i,"-");
  if (iVar2 == 0) {
    _i = (char *)0x0;
  }
  unzip_exclude_mode = 0;
  while( true ) {
    local_24 = iVar1 + 1;
    bVar5 = false;
    if (local_24 < argc) {
      bVar5 = *argv[local_24] != '-';
    }
    if (!bVar5) break;
    add_pattern(&include,argv[local_24]);
    iVar1 = local_24;
  }
  local_24 = getopts(argc - iVar1,argv + iVar1);
  local_24 = local_24 + iVar1;
  if (unzip_exclude_mode != 0) {
    while( true ) {
      bVar5 = false;
      if (local_24 < argc) {
        bVar5 = *argv[local_24] != '-';
      }
      if (!bVar5) break;
      add_pattern(&exclude,argv[local_24]);
      local_24 = local_24 + 1;
    }
    local_24 = local_24 + -1;
    iVar1 = getopts(argc - local_24,argv + local_24);
    local_24 = iVar1 + local_24;
  }
  while (local_24 < argc) {
    add_pattern(&include,argv[local_24]);
    local_24 = local_24 + 1;
  }
  if (1 < n_opt + o_opt + u_opt) {
    errorx("-n, -o and -u are contradictory");
  }
  unzip(_i);
  exit(0);
}

Assistant:

int
main(int argc, char *argv[])
{
	const char *zipfile;
	int nopts;

	lafe_setprogname(*argv, "bsdunzip");

#if HAVE_SETLOCALE
	if (setlocale(LC_ALL, "") == NULL)
		lafe_warnc(0, "Failed to set default locale");
#endif

	if (isatty(STDOUT_FILENO))
		tty = 1;

	if (getenv("UNZIP_DEBUG") != NULL)
		unzip_debug = 1;
	for (int i = 0; i < argc; ++i)
		debug("%s%c", argv[i], (i < argc - 1) ? ' ' : '\n');

#ifdef __GLIBC__
	/* Prevent GNU getopt(3) from rearranging options. */
	setenv("POSIXLY_CORRECT", "", 1);
#endif
	/*
	 * Info-ZIP's unzip(1) expects certain options to come before the
	 * zipfile name, and others to come after - though it does not
	 * enforce this.  For simplicity, we accept *all* options both
	 * before and after the zipfile name.
	 */
	nopts = getopts(argc, argv);

	if (version_opt == 1)
		version();

	/*
	 * When more of the zipinfo mode options are implemented, this
	 * will need to change.
	 */
	if (zipinfo_mode && !Z1_opt) {
		printf("Zipinfo mode needs additional options\n");
		exit(EXIT_FAILURE);
	}

	if (argc <= nopts)
		usage();
	zipfile = argv[nopts++];

	if (strcmp(zipfile, "-") == 0)
		zipfile = NULL; /* STDIN */

	unzip_exclude_mode = 0;

	while (nopts < argc && *argv[nopts] != '-')
		add_pattern(&include, argv[nopts++]);

	nopts--; /* fake argv[0] */
	nopts += getopts(argc - nopts, argv + nopts);

	/*
	 * For compatibility with Info-ZIP's unzip(1) we need to treat
	 * non-option arguments following an -x after the zipfile as
	 * exclude list members.
	 */
	if (unzip_exclude_mode) {
		while (nopts < argc && *argv[nopts] != '-')
			add_pattern(&exclude, argv[nopts++]);
		nopts--; /* fake argv[0] */
		nopts += getopts(argc - nopts, argv + nopts);
	}

	/* There may be residual arguments if we encountered -- */
	while (nopts < argc)
		add_pattern(&include, argv[nopts++]);

	if (n_opt + o_opt + u_opt > 1)
		errorx("-n, -o and -u are contradictory");

	unzip(zipfile);

	exit(EXIT_SUCCESS);
}